

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildCase(int nToken,CNscPStackEntry *pCond)

{
  NscSymbolFence *pNVar1;
  CNscPStackEntry *this;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  byte bVar3;
  undefined8 in_RCX;
  char *pcVar4;
  size_t nCaseSize;
  NscPCodeHeader *pv;
  size_t *pauchData;
  NscSymbolFence **ppNVar5;
  int nCaseValue;
  undefined8 local_48;
  size_t *local_40;
  size_t local_38;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pCond != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pCond->m_link,&g_pCtx->m_listEntryFree);
    }
    CNscPStackEntry::SetType(this,NscType_Unknown);
    return this;
  }
  if (pCond == (CNscPStackEntry *)0x0) {
    local_38 = 0;
    nCaseSize = 0;
    pauchData = (size_t *)0x0;
    in_RCX = 0;
    if (nToken == 0x128) {
LAB_0015e6ba:
      nCaseSize = local_38;
      CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorConditionalTokenRequiresInt,"case");
      CNscPStackEntry::SetType(this,NscType_Error);
LAB_0015e6db:
      in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
      if (this->m_nType != NscType_Error) {
        NscSimplifyConstant((uchar *)pauchData,&local_38);
        nCaseSize = local_38;
        if (((local_38 == 0) || (*pauchData != local_38)) || ((int)pauchData[1] != 0x34)) {
          CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorCaseValueNotConstant);
          CNscPStackEntry::SetType(this,NscType_Error);
        }
        in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
      }
    }
  }
  else {
    if (pCond->m_nType == NscType_Error) {
      CNscPStackEntry::SetType(this,NscType_Error);
      goto LAB_0015e7da;
    }
    pauchData = (size_t *)pCond->m_pauchData;
    nCaseSize = pCond->m_nDataSize;
    local_38 = nCaseSize;
    if (nToken == 0x128) {
      if (pCond->m_nType != NscType_Integer) goto LAB_0015e6ba;
      goto LAB_0015e6db;
    }
    in_RCX = 0;
  }
  if (this->m_nType != NscType_Error) {
    ppNVar5 = &g_pCtx->m_pCurrentFence;
    while (pNVar1 = *ppNVar5, local_40 = pauchData, pNVar1 != (NscSymbolFence *)0x0) {
      if (pNVar1->nFenceType != NscFenceType_Scope) {
        if (pNVar1->nFenceType == NscFenceType_Switch) {
          local_48 = in_RCX;
          if (pNVar1->nLocals != 0) {
            pcVar4 = "case";
            if (nToken == 0x12a) {
              pcVar4 = "default";
            }
            CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorDeclarationSkippedByToken,pcVar4);
          }
          if (nToken == 0x12a) {
            if (pNVar1->fHasDefault == true) {
              CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorMultipleDefaultLabels);
              CNscPStackEntry::SetType(this,NscType_Error);
            }
            else {
              pNVar1->fHasDefault = true;
            }
            bVar3 = (byte)local_48;
          }
          else {
            nCaseValue = CNscPStackEntry::GetInteger(pCond);
            _Var2 = std::
                    __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                              (*(undefined8 *)pNVar1->field_9,
                               *(undefined8 *)((long)pNVar1->field_9 + 8));
            if (_Var2._M_current == *(pointer *)((long)pNVar1->field_9 + 8)) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)pNVar1->field_9,&nCaseValue);
            }
            else {
              CNscContext::GenerateMessage
                        (g_pCtx,NscMessage_ErrorDuplicateCaseValue,(ulong)(uint)nCaseValue);
            }
            bVar3 = (byte)local_48;
          }
          if (this->m_nType != NscType_Error) {
            if (nToken != 0x12a && bVar3 == 0) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                            ,0x1652,"CNscPStackEntry *NscBuildCase(int, CNscPStackEntry *)");
            }
            CNscPStackEntry::PushCase
                      (this,NscPCode_Default - bVar3,(uchar *)local_40,nCaseSize,
                       g_pCtx->m_anFileNumbers[0],g_pCtx->m_anLineNumbers[0]);
            CNscPStackEntry::SetType(this,NscType_Unknown);
          }
          goto LAB_0015e7d5;
        }
        break;
      }
      ppNVar5 = &pNVar1->pNext;
    }
    CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningCaseDefaultOutsideSwitch);
  }
LAB_0015e7d5:
  if (pCond == (CNscPStackEntry *)0x0) {
    return this;
  }
LAB_0015e7da:
  CNwnDoubleLinkList::InsertAfter(&pCond->m_link,&g_pCtx->m_listEntryFree);
  return this;
}

Assistant:

YYSTYPE NscBuildCase (int nToken, YYSTYPE pCond)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pCond)
			g_pCtx ->FreePStackEntry (pCond);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}

	//
	// Check for silent errors
	//

	if (pCond != NULL && pCond ->GetType () == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, normal processing
	//

	else
	{

		//
		// Get the conditional
		//

		unsigned char *pauchCond = NULL;
		size_t nCondSize = 0;
		if (pCond)
		{
			pauchCond = pCond ->GetData ();
			nCondSize = pCond ->GetDataSize ();
		}

		//
		// If this is a case
		//

		if (nToken == CASE)
		{

			//
			// Validate the conditional
			//

			if (pCond == NULL || pCond ->GetType () != NscType_Integer)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorConditionalTokenRequiresInt,
					"case");
				pOut ->SetType (NscType_Error);
			}

			//
			// Make sure the conditional is constant.
			//
			// We have to make a special check for a negated integer
			// to support unoptimized Bioware script support.
			//

			if (pOut ->GetType () != NscType_Error)
			{
				
				//
				// Simplify the constant
				//

				NscSimplifyConstant (pauchCond, nCondSize);

				//
				// Not a simple constant integer
				//

				if (!CNscPStackEntry::IsSimpleConstant (pauchCond, nCondSize))
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorCaseValueNotConstant);
					pOut ->SetType (NscType_Error);
				}
			}
		}

		//
		// If we are still good
		//

		if (pOut ->GetType () != NscType_Error)
		{

			//
			// Validate that the case or default is in a proper scope
			//

			NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
			while (pFence && pFence ->nFenceType == NscFenceType_Scope)
				pFence = pFence ->pNext;
			if (pFence == NULL || pFence ->nFenceType != NscFenceType_Switch)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_WarningCaseDefaultOutsideSwitch);
				goto no_switch_fence;
				//pOut ->SetType (NscType_Error);
			}
			else
			{
				if (pFence ->nLocals != 0)
				{
					g_pCtx ->GenerateMessage (
						NscMessage_ErrorDeclarationSkippedByToken,
						(nToken == DEFAULT) ? "default" : "case");

				}
			}

			//
			// Test for only one default
			//

			if (nToken == DEFAULT)
			{
				if (pFence ->fHasDefault)
				{
					g_pCtx ->GenerateMessage (
						NscMessage_ErrorMultipleDefaultLabels);
					pOut ->SetType (NscType_Error);
				}
				else
					pFence ->fHasDefault = true;
			}
			else
			{

				//
				// Test for non-unique case scan value
				//

				int nCaseValue = pCond ->GetInteger ();

				if (std::find (
					pFence ->pSwitchCasesUsed ->begin (),
					pFence ->pSwitchCasesUsed ->end (),
					nCaseValue) != pFence ->pSwitchCasesUsed ->end ()) {

					g_pCtx ->GenerateMessage (
						NscMessage_ErrorDuplicateCaseValue,
						nCaseValue);
				}
				else
					pFence ->pSwitchCasesUsed ->push_back (nCaseValue);
			}
		}

		//
		// If we are still good
		//

		if (pOut ->GetType () != NscType_Error)
		{

			//
			// Push the pcode
			//

			NscPCode nPCode;
			if (nToken == CASE)
				nPCode = NscPCode_Case;
			else if (nToken == DEFAULT)
				nPCode = NscPCode_Default;
			else
			{
				nPCode = NscPCode_Case;
				assert (false);
			}
			pOut ->PushCase (nPCode, pauchCond, nCondSize,
				g_pCtx ->GetFile (0), g_pCtx ->GetLine (0));

			//
			// Set the return type
			//

			pOut ->SetType (NscType_Unknown);
		}
	}

	//
	// Return results
	//

no_switch_fence:
	if (pCond)
        g_pCtx ->FreePStackEntry (pCond);
	return pOut;
}